

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O0

string * __thiscall Args::GroupIface::name_abi_cxx11_(GroupIface *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x28));
  return in_RDI;
}

Assistant:

String name() const override
	{
		return m_name;
	}